

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O1

void __thiscall Clasp::Cli::LemmaLogger::LemmaLogger(LemmaLogger *this,string *to,Options *o)

{
  size_t __n;
  uint32 uVar1;
  bool bVar2;
  undefined2 uVar3;
  int iVar4;
  FILE *pFVar5;
  
  iVar4 = std::__cxx11::string::compare((char *)to);
  pFVar5 = _stdout;
  if ((iVar4 != 0) &&
     ((__n = to->_M_string_length, __n != DAT_001eda70 ||
      ((__n != 0 &&
       (iVar4 = bcmp((to->_M_dataplus)._M_p,stdoutStr_abi_cxx11_,__n), pFVar5 = _stdout, iVar4 != 0)
       ))))) {
    pFVar5 = fopen((to->_M_dataplus)._M_p,"w");
  }
  this->str_ = (FILE *)pFVar5;
  (this->solver2asp_).ebo_.buf = (pointer)0x0;
  (this->solver2asp_).ebo_.size = 0;
  (this->solver2asp_).ebo_.cap = 0;
  (this->solver2NameIdx_).ebo_.buf = (pointer)0x0;
  (this->solver2NameIdx_).ebo_.size = 0;
  (this->solver2NameIdx_).ebo_.cap = 0;
  this->inputType_ = Asp;
  uVar1 = o->lbdMax;
  (this->options_).logMax = o->logMax;
  (this->options_).lbdMax = uVar1;
  bVar2 = o->logText;
  uVar3 = *(undefined2 *)&o->field_0xa;
  (this->options_).domOut = o->domOut;
  (this->options_).logText = bVar2;
  *(undefined2 *)&(this->options_).field_0xa = uVar3;
  this->step_ = 0;
  if (pFVar5 == (FILE *)0x0) {
    Potassco::fail(-3,"Clasp::Cli::LemmaLogger::LemmaLogger(const std::string &, const Options &)",
                   0x238,"str_","Could not open lemma log file \'%s\'!",(to->_M_dataplus)._M_p,0);
  }
  return;
}

Assistant:

LemmaLogger::LemmaLogger(const std::string& to, const Options& o)
	: str_(isStdOut(to) ? stdout : fopen(to.c_str(), "w"))
	, inputType_(Problem_t::Asp)
	, options_(o)
	, step_(0) {
	POTASSCO_EXPECT(str_, "Could not open lemma log file '%s'!", to.c_str());
}